

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O0

xmlParserErrors
testResourceLoader(void *vctxt,char *URL,char *ID,xmlResourceType type,xmlParserInputFlags flags,
                  xmlParserInputPtr *out)

{
  int iVar1;
  xmlParserErrors xVar2;
  xmlParserInputPtr pxVar3;
  int local_3c;
  int i;
  xmlParserInputPtr *out_local;
  xmlParserInputFlags flags_local;
  xmlResourceType type_local;
  char *ID_local;
  char *URL_local;
  void *vctxt_local;
  
  local_3c = 0;
  while( true ) {
    if (nb_entities <= local_3c) {
      xVar2 = xmlNewInputFromUrl(URL,0,out);
      return xVar2;
    }
    iVar1 = strcmp(testEntitiesName[local_3c],URL);
    if (iVar1 == 0) break;
    local_3c = local_3c + 1;
  }
  pxVar3 = (xmlParserInputPtr)
           xmlNewInputFromString(testEntitiesName[local_3c],testEntitiesValue[local_3c],2);
  *out = pxVar3;
  return XML_ERR_OK;
}

Assistant:

static xmlParserErrors
testResourceLoader(void *vctxt ATTRIBUTE_UNUSED, const char *URL,
                   const char *ID ATTRIBUTE_UNUSED,
                   xmlResourceType type ATTRIBUTE_UNUSED,
                   xmlParserInputFlags flags ATTRIBUTE_UNUSED,
                   xmlParserInputPtr *out) {
    int i;

    for (i = 0; i < nb_entities; i++) {
        if (!strcmp(testEntitiesName[i], URL)) {
	    *out = xmlNewInputFromString(testEntitiesName[i],
                                        testEntitiesValue[i],
                                        XML_INPUT_BUF_STATIC);
	    return(XML_ERR_OK);
	}
    }

    return(xmlNewInputFromUrl(URL, 0, out));
}